

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

sstack<dlib::sgd> __thiscall dlib::sstack<dlib::sgd>::pop(sstack<dlib::sgd> *this,size_t num)

{
  uint *puVar1;
  ostream *poVar2;
  fatal_error *this_00;
  sstack<dlib::sgd> sVar3;
  ostringstream dlib_o_out;
  string local_1b0;
  long local_190 [3];
  uint auStack_178 [88];
  
  sVar3.mysize = this->mysize - num;
  if (num <= this->mysize) {
    sVar3.data = this->data + num;
    return sVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x239);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
             ,0x78);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"sstack<T> dlib::sstack<dlib::sgd>::pop(size_t) [T = dlib::sgd]",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"num <= size()",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"You can\'t pop more things from the stack than it has in it.",
             0x3b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

sstack pop(size_t num=1) 
        { 
            DLIB_CASSERT(num <= size(), "You can't pop more things from the stack than it has in it.");
            return sstack(data+num, mysize-num);
        }